

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_util.c
# Opt level: O0

lzma_vli lzma_block_unpadded_size(lzma_block *block)

{
  uint uVar1;
  lzma_vli lVar2;
  uint32_t uVar3;
  lzma_vli unpadded_size;
  lzma_block *block_local;
  
  if ((((((block == (lzma_block *)0x0) || (1 < block->version)) || (block->header_size < 8)) ||
       ((0x400 < block->header_size || ((block->header_size & 3) != 0)))) ||
      ((0x7fffffffffffffff < block->compressed_size &&
       (block->compressed_size != 0xffffffffffffffff)))) ||
     ((block->compressed_size == 0 || (0xf < block->check)))) {
    block_local = (lzma_block *)0x0;
  }
  else if (block->compressed_size == 0xffffffffffffffff) {
    block_local = (lzma_block *)0xffffffffffffffff;
  }
  else {
    lVar2 = block->compressed_size;
    uVar1 = block->header_size;
    uVar3 = lzma_check_size(block->check);
    block_local = (lzma_block *)(lVar2 + uVar1 + (ulong)uVar3);
    if (block_local < (lzma_block *)0x5) {
      __assert_fail("unpadded_size >= UNPADDED_SIZE_MIN",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/block_util.c"
                    ,0x49,"lzma_vli lzma_block_unpadded_size(const lzma_block *)");
    }
    if ((lzma_block *)0x7ffffffffffffffc < block_local) {
      block_local = (lzma_block *)0x0;
    }
  }
  return (lzma_vli)block_local;
}

Assistant:

extern LZMA_API(lzma_vli)
lzma_block_unpadded_size(const lzma_block *block)
{
	// Validate the values that we are interested in i.e. all but
	// Uncompressed Size and the filters.
	//
	// NOTE: This function is used for validation too, so it is
	// essential that these checks are always done even if
	// Compressed Size is unknown.
	if (block == NULL || block->version > 1
			|| block->header_size < LZMA_BLOCK_HEADER_SIZE_MIN
			|| block->header_size > LZMA_BLOCK_HEADER_SIZE_MAX
			|| (block->header_size & 3)
			|| !lzma_vli_is_valid(block->compressed_size)
			|| block->compressed_size == 0
			|| (unsigned int)(block->check) > LZMA_CHECK_ID_MAX)
		return 0;

	// If Compressed Size is unknown, return that we cannot know
	// size of the Block either.
	if (block->compressed_size == LZMA_VLI_UNKNOWN)
		return LZMA_VLI_UNKNOWN;

	// Calculate Unpadded Size and validate it.
	const lzma_vli unpadded_size = block->compressed_size
				+ block->header_size
				+ lzma_check_size(block->check);

	assert(unpadded_size >= UNPADDED_SIZE_MIN);
	if (unpadded_size > UNPADDED_SIZE_MAX)
		return 0;

	return unpadded_size;
}